

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl::release(Private_Impl *this)

{
  Private_Impl *in_RDI;
  RASPIVID_STATE *in_stack_ffffffffffffffe8;
  
  if ((in_RDI->_isOpened & 1U) != 0) {
    if ((in_RDI->camera_video_port != (MMAL_PORT_T *)0x0) &&
       (in_RDI->camera_video_port->is_enabled != 0)) {
      mmal_port_disable(in_RDI->camera_video_port);
      in_RDI->camera_video_port = (MMAL_PORT_T *)0x0;
    }
    if ((in_RDI->State).camera_component != (MMAL_COMPONENT_T *)0x0) {
      mmal_component_disable((in_RDI->State).camera_component);
    }
    destroy_camera_component(in_RDI,in_stack_ffffffffffffffe8);
    in_RDI->_isOpened = false;
    in_RDI->_isCapturing = false;
  }
  return;
}

Assistant:

void Private_Impl::release() {
            if ( !_isOpened ) return;

            // Disable camera_video_port
            if ( camera_video_port && camera_video_port->is_enabled ) {
                mmal_port_disable ( camera_video_port );
                camera_video_port = NULL;
            }
            ////
            // Disable all our ports that are not handled by connections
            if ( State.camera_component )
                mmal_component_disable ( State.camera_component );


            destroy_camera_component ( &State );

            _isOpened=false;
            _isCapturing=false;

        }